

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

uchar __thiscall v128::To<unsigned_char>(v128 *this,int lane)

{
  uchar local_15;
  int local_14;
  uchar result;
  v128 *pvStack_10;
  int lane_local;
  v128 *this_local;
  
  local_14 = lane;
  pvStack_10 = this;
  if (lane + 1U < 0x11) {
    wabt::MemcpyEndianAware(&local_15,this,1,0x10,0,(long)lane,1);
    return local_15;
  }
  __assert_fail("(lane + 1) * sizeof(T) <= sizeof(v)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/common.h"
                ,0x8b,"T v128::To(int) const [T = unsigned char]");
}

Assistant:

T To(int lane) const {
    static_assert(sizeof(T) <= sizeof(v), "Invalid cast!");
    assert((lane + 1) * sizeof(T) <= sizeof(v));
    T result;
    wabt::MemcpyEndianAware(&result, v, sizeof(result), sizeof(v), 0,
                            lane * sizeof(T), sizeof(result));
    return result;
  }